

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O3

void Gia_ManStaticFanoutStop(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = p->vFanoutNums;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vFanoutNums->pArray = (int *)0x0;
      pVVar1 = p->vFanoutNums;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_00207fe7;
    }
    free(pVVar1);
    p->vFanoutNums = (Vec_Int_t *)0x0;
  }
LAB_00207fe7:
  pVVar1 = p->vFanout;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vFanout->pArray = (int *)0x0;
      pVVar1 = p->vFanout;
      if (pVVar1 == (Vec_Int_t *)0x0) {
        return;
      }
    }
    free(pVVar1);
    p->vFanout = (Vec_Int_t *)0x0;
  }
  return;
}

Assistant:

void Gia_ManStaticFanoutStop( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vFanoutNums );
    Vec_IntFreeP( &p->vFanout );
}